

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall smf::MidiMessage::setSpelling(MidiMessage *this,int base7,int accidental)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined *puVar5;
  uint uVar6;
  
  bVar1 = isNoteOn(this);
  if (!bVar1) {
    return;
  }
  iVar2 = getVelocity(this);
  if (iVar2 < 4) {
    setVelocity(this,4);
  }
  uVar3 = 0;
  uVar6 = 0;
  switch((long)base7 % 7 & 0xffffffff) {
  case 0:
  case 4:
    uVar6 = uVar3;
    if (4 < accidental + 2U) goto switchD_0011c21e_default;
    uVar4 = (ulong)(accidental + 2U);
    puVar5 = &DAT_00121cb0;
    break;
  case 1:
  case 5:
    uVar6 = uVar3;
    if (4 < accidental + 2U) goto switchD_0011c21e_default;
    uVar4 = (ulong)(accidental + 2U);
    puVar5 = &DAT_00121cc4;
    break;
  case 2:
  case 6:
    if (4 < accidental + 2U) goto switchD_0011c21e_default;
    uVar4 = (ulong)(accidental + 2U);
    puVar5 = &DAT_00121cd8;
    break;
  case 3:
    uVar6 = uVar3;
    if (5 < accidental + 2U) goto switchD_0011c21e_default;
    uVar4 = (ulong)(accidental + 2U);
    puVar5 = &DAT_00121c98;
    break;
  default:
    goto switchD_0011c21e_default;
  }
  uVar6 = *(uint *)(puVar5 + uVar4 * 4);
switchD_0011c21e_default:
  uVar3 = getVelocity(this);
  setVelocity(this,uVar6 | uVar3 & 0xfc);
  return;
}

Assistant:

void MidiMessage::setSpelling(int base7, int accidental) {
	if (!isNoteOn()) {
		return;
	}
	// The bottom two bits of the attack velocity are used for the
	// spelling, so need to make sure the velocity will not accidentally
	// be set to zero (and make the note-on a note-off).
	if (getVelocity() < 4) {
		setVelocity(4);
	}
	int dpc = base7 % 7;
	uchar spelling = 0;

	// Table 5.1, page 101 in Beyond MIDI (1997)
	// http://beyondmidi.ccarh.org/beyondmidi-600dpi.pdf
	switch (dpc) {

		case 0:
			switch (accidental) {
				case -2: spelling = 1; break; // Cbb
				case -1: spelling = 1; break; // Cb
				case  0: spelling = 2; break; // C
				case +1: spelling = 2; break; // C#
				case +2: spelling = 3; break; // C##
			}
			break;

		case 1:
			switch (accidental) {
				case -2: spelling = 1; break; // Dbb
				case -1: spelling = 1; break; // Db
				case  0: spelling = 2; break; // D
				case +1: spelling = 3; break; // D#
				case +2: spelling = 3; break; // D##
			}
			break;

		case 2:
			switch (accidental) {
				case -2: spelling = 1; break; // Ebb
				case -1: spelling = 2; break; // Eb
				case  0: spelling = 2; break; // E
				case +1: spelling = 3; break; // E#
				case +2: spelling = 3; break; // E##
			}
			break;

		case 3:
			switch (accidental) {
				case -2: spelling = 1; break; // Fbb
				case -1: spelling = 1; break; // Fb
				case  0: spelling = 2; break; // F
				case +1: spelling = 2; break; // F#
				case +2: spelling = 3; break; // F##
				case +3: spelling = 3; break; // F###
			}
			break;

		case 4:
			switch (accidental) {
				case -2: spelling = 1; break; // Gbb
				case -1: spelling = 1; break; // Gb
				case  0: spelling = 2; break; // G
				case +1: spelling = 2; break; // G#
				case +2: spelling = 3; break; // G##
			}
			break;

		case 5:
			switch (accidental) {
				case -2: spelling = 1; break; // Abb
				case -1: spelling = 1; break; // Ab
				case  0: spelling = 2; break; // A
				case +1: spelling = 3; break; // A#
				case +2: spelling = 3; break; // A##
			}
			break;

		case 6:
			switch (accidental) {
				case -2: spelling = 1; break; // Bbb
				case -1: spelling = 2; break; // Bb
				case  0: spelling = 2; break; // B
				case +1: spelling = 3; break; // B#
				case +2: spelling = 3; break; // B##
			}
			break;

	}

	uchar vel = getVelocity();
	// suppress any previous content in the first two bits:
	vel = vel & 0xFC;
	// insert the spelling code:
	vel = vel | spelling;
	setVelocity(vel);
}